

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O0

err_t btokCVCMatch(octet *cert,size_t cert_len,octet *privkey,size_t privkey_len)

{
  blob_t pvVar1;
  btok_cvc_t *cvc;
  err_t code;
  size_t in_stack_00000038;
  octet *in_stack_00000040;
  size_t in_stack_00000048;
  octet *in_stack_00000050;
  btok_cvc_t *in_stack_00000058;
  size_t in_stack_00000130;
  octet *in_stack_00000138;
  size_t in_stack_00000140;
  octet *in_stack_00000148;
  size_t in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  pvVar1 = blobCreate(in_stack_ffffffffffffffc8);
  if (pvVar1 == (blob_t)0x0) {
    local_4 = 0x6e;
  }
  else {
    local_4 = btokCVCUnwrap(in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000040,
                            in_stack_00000038);
    if (local_4 == 0) {
      local_4 = btokKeypairVal(in_stack_00000148,in_stack_00000140,in_stack_00000138,
                               in_stack_00000130);
      blobClose((blob_t)0x15365f);
    }
    else {
      blobClose((blob_t)0x153626);
    }
  }
  return local_4;
}

Assistant:

err_t btokCVCMatch(const octet cert[], size_t cert_len, const octet privkey[],
	size_t privkey_len)
{
	err_t code;
	btok_cvc_t* cvc;
	// выделить память
	cvc = (btok_cvc_t*)blobCreate(sizeof(btok_cvc_t));
	if (!cvc)
		return ERR_OUTOFMEMORY;
	// разобрать сертификат
	code = btokCVCUnwrap(cvc, cert, cert_len, 0, 0);
	ERR_CALL_HANDLE(code, blobClose(cvc));
	// проверить соответствие
	code = btokKeypairVal(privkey, privkey_len, cvc->pubkey, cvc->pubkey_len);
	// завершить
	blobClose(cvc);
	return code;
}